

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

_Bool X86_lockrep(MCInst *MI,SStream *O)

{
  uint8_t uVar1;
  _Bool _Var2;
  uint uVar3;
  _Bool local_1d;
  _Bool res;
  uint opcode;
  SStream *O_local;
  MCInst *MI_local;
  
  local_1d = false;
  uVar1 = MI->x86_prefix[0];
  if (uVar1 == 0xf0) {
    SStream_concat(O,"lock|");
  }
  else if (uVar1 == 0xf2) {
    uVar3 = MCInst_getOpcode(MI);
    _Var2 = valid_repne(MI->csh,uVar3);
    if (_Var2) {
      SStream_concat(O,"repne|");
    }
    else {
      MI->x86_prefix[0] = '\0';
      local_1d = uVar3 == 0x6e9;
      if (local_1d) {
        MCInst_setOpcode(MI,0x6ee);
        SStream_concat(O,"mulsd\t");
      }
    }
  }
  else if (uVar1 == 0xf3) {
    uVar3 = MCInst_getOpcode(MI);
    _Var2 = valid_rep(MI->csh,uVar3);
    if (_Var2) {
      SStream_concat(O,"rep|");
    }
    else {
      _Var2 = valid_repe(MI->csh,uVar3);
      if (_Var2) {
        SStream_concat(O,"repe|");
      }
      else {
        MI->x86_prefix[0] = '\0';
        local_1d = uVar3 == 0x6e9;
        if (local_1d) {
          MCInst_setOpcode(MI,0x6f2);
          SStream_concat(O,"mulss\t");
        }
      }
    }
  }
  if (MI->csh->detail != CS_OPT_OFF) {
    *(undefined4 *)(MI->flat_insn->detail->field_6).x86.prefix = *(undefined4 *)MI->x86_prefix;
  }
  return local_1d;
}

Assistant:

bool X86_lockrep(MCInst *MI, SStream *O)
{
	unsigned int opcode;
	bool res = false;

	switch(MI->x86_prefix[0]) {
		default:
			break;
		case 0xf0:
#ifndef CAPSTONE_DIET
			SStream_concat(O, "lock|");
#endif
			break;
		case 0xf2:	// repne
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_repne(MI->csh, opcode)) {
				SStream_concat(O, "repne|");
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSDrr);
					SStream_concat(O, "mulsd\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_repne(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSDrr);
			}
#endif
#endif
			break;

		case 0xf3:
			opcode = MCInst_getOpcode(MI);
#ifndef CAPSTONE_DIET	// only care about memonic in standard (non-diet) mode
			if (valid_rep(MI->csh, opcode)) {
				SStream_concat(O, "rep|");
			} else if (valid_repe(MI->csh, opcode)) {
				SStream_concat(O, "repe|");
			} else {
				// invalid prefix
				MI->x86_prefix[0] = 0;

				// handle special cases
#ifndef CAPSTONE_X86_REDUCE
				if (opcode == X86_MULPDrr) {
					MCInst_setOpcode(MI, X86_MULSSrr);
					SStream_concat(O, "mulss\t");
					res = true;
				}
#endif
			}
#else	// diet mode -> only patch opcode in special cases
			if (!valid_rep(MI->csh, opcode) && !valid_repe(MI->csh, opcode)) {
				MI->x86_prefix[0] = 0;
			}
#ifndef CAPSTONE_X86_REDUCE
			// handle special cases
			if (opcode == X86_MULPDrr) {
				MCInst_setOpcode(MI, X86_MULSSrr);
			}
#endif
#endif
			break;
	}

	// copy normalized prefix[] back to x86.prefix[]
	if (MI->csh->detail)
		memcpy(MI->flat_insn->detail->x86.prefix, MI->x86_prefix, ARR_SIZE(MI->x86_prefix));

	return res;
}